

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::reportError(Parser *this,string *s)

{
  ParserInputState *pPVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pPVar1 = ((this->inputState).ref)->ptr;
  pcVar2 = (pPVar1->filename)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (pPVar1->filename)._M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)&local_48);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: ",7);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(s->_M_dataplus)._M_p,s->_M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error in ",9);
    pPVar1 = ((this->inputState).ref)->ptr;
    pcVar2 = (pPVar1->filename)._M_dataplus._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + (pPVar1->filename)._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_48,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(s->_M_dataplus)._M_p,s->_M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  return;
}

Assistant:

void Parser::reportError(const std::string& s)
{
	if ( getFilename()=="" )
		std::cout << "Error: " << s << std::endl;
	else
		std::cout << "Error in " << getFilename() << ": " << s << std::endl;
}